

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap)

{
  uint uVar1;
  uint uVar2;
  btCollisionShape *pbVar3;
  btCollisionAlgorithm **ptr;
  btDispatcher *pbVar4;
  int i;
  uint uVar5;
  int iVar6;
  btCollisionAlgorithm **ppbVar7;
  long lVar8;
  undefined4 extraout_var;
  ulong uVar9;
  btCollisionObjectWrapper *pbVar10;
  btCollisionObjectWrapper *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  pbVar10 = body1Wrap;
  if (this->m_isSwapped != false) {
    pbVar10 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pbVar3 = body0Wrap->m_shape;
  uVar1 = *(uint *)((long)&pbVar3[1]._vptr_btCollisionShape + 4);
  uVar2 = (this->m_childCollisionAlgorithms).m_size;
  if ((int)uVar2 < (int)uVar1) {
    if ((this->m_childCollisionAlgorithms).m_capacity < (int)uVar1) {
      if (uVar1 == 0) {
        ppbVar7 = (btCollisionAlgorithm **)0x0;
        uVar5 = uVar2;
      }
      else {
        ppbVar7 = (btCollisionAlgorithm **)btAlignedAllocInternal((long)(int)uVar1 * 8,0x10);
        uVar5 = (this->m_childCollisionAlgorithms).m_size;
      }
      if (0 < (int)uVar5) {
        uVar9 = 0;
        do {
          ppbVar7[uVar9] = (this->m_childCollisionAlgorithms).m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      ptr = (this->m_childCollisionAlgorithms).m_data;
      if ((ptr != (btCollisionAlgorithm **)0x0) &&
         ((this->m_childCollisionAlgorithms).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_childCollisionAlgorithms).m_ownsMemory = true;
      (this->m_childCollisionAlgorithms).m_data = ppbVar7;
      (this->m_childCollisionAlgorithms).m_capacity = uVar1;
    }
    lVar8 = (long)(int)uVar2;
    do {
      (this->m_childCollisionAlgorithms).m_data[lVar8] = (btCollisionAlgorithm *)0x0;
      lVar8 = lVar8 + 1;
    } while ((int)uVar1 != lVar8);
  }
  (this->m_childCollisionAlgorithms).m_size = uVar1;
  if (0 < (int)uVar1) {
    lVar8 = 0x40;
    uVar9 = 0;
    do {
      if (pbVar3[3]._vptr_btCollisionShape == (_func_int **)0x0) {
        local_50 = *(undefined8 *)((long)pbVar3[1].m_userPointer + lVar8);
        local_48 = *(undefined4 *)&body0Wrap->m_collisionObject;
        uStack_44 = *(undefined4 *)((long)&body0Wrap->m_collisionObject + 4);
        uStack_40 = *(undefined4 *)&body0Wrap->m_worldTransform;
        uStack_3c = *(undefined4 *)((long)&body0Wrap->m_worldTransform + 4);
        local_38 = 0xffffffff;
        local_34 = (undefined4)uVar9;
        pbVar4 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.
                 m_dispatcher;
        local_58 = body0Wrap;
        iVar6 = (*pbVar4->_vptr_btDispatcher[2])(pbVar4,&local_58,pbVar10,this->m_sharedManifold);
        (this->m_childCollisionAlgorithms).m_data[uVar9] =
             (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar6);
      }
      else {
        (this->m_childCollisionAlgorithms).m_data[uVar9] = (btCollisionAlgorithm *)0x0;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x58;
    } while (uVar1 != uVar9);
  }
  return;
}

Assistant:

void	btCompoundCollisionAlgorithm::preallocateChildAlgorithms(const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;
	btAssert (colObjWrap->getCollisionShape()->isCompound());
	
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;
	
	m_childCollisionAlgorithms.resize(numChildren);
	for (i=0;i<numChildren;i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		} else
		{
			
			const btCollisionShape* childShape = compoundShape->getChildShape(i);

			btCollisionObjectWrapper childWrap(colObjWrap,childShape,colObjWrap->getCollisionObject(),colObjWrap->getWorldTransform(),-1,i);//wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap,otherObjWrap,m_sharedManifold);
		}
	}
}